

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O1

void __thiscall GEO::LineInput::get_fields(LineInput *this,char *separators)

{
  pointer *pppcVar1;
  iterator __position;
  char *context;
  char *local_38;
  char *local_30;
  
  std::vector<char_*,_std::allocator<char_*>_>::resize(&this->field_,0);
  local_30 = (char *)0x0;
  local_38 = strtok_r(this->line_,separators,&local_30);
  if (local_38 != (char *)0x0) {
    do {
      __position._M_current =
           (this->field_).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->field_).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<char*,std::allocator<char*>>::_M_realloc_insert<char*const&>
                  ((vector<char*,std::allocator<char*>> *)&this->field_,__position,&local_38);
      }
      else {
        *__position._M_current = local_38;
        pppcVar1 = &(this->field_).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        *pppcVar1 = *pppcVar1 + 1;
      }
      local_38 = strtok_r((char *)0x0,separators,&local_30);
    } while (local_38 != (char *)0x0);
  }
  return;
}

Assistant:

void LineInput::get_fields(const char* separators) {
        field_.resize(0);
        char* context = nullptr;
        char* tok = safe_strtok(line_, separators, &context);
        while(tok != nullptr) {
            field_.push_back(tok);
            tok = safe_strtok(nullptr, separators, &context);
        }
    }